

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O0

SocketLinux * rcdiscover::SocketLinux::create(in_addr_t dst_ip,uint16_t port,string *iface_name)

{
  string *in_RCX;
  SocketLinux *in_RDI;
  uint16_t in_stack_0000004e;
  in_addr_t in_stack_00000050;
  int in_stack_00000054;
  int in_stack_00000058;
  int in_stack_0000005c;
  string *in_stack_00000070;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RCX);
  SocketLinux((SocketLinux *)iface_name,in_stack_0000005c,in_stack_00000058,in_stack_00000054,
              in_stack_00000050,in_stack_0000004e,in_stack_00000070);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

SocketLinux SocketLinux::create(const in_addr_t dst_ip, const uint16_t port,
                                std::string iface_name)
{
  return SocketLinux(AF_INET, SOCK_DGRAM, IPPROTO_UDP, dst_ip, port,
                     std::move(iface_name));
}